

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool __thiscall
duckdb::TryCast::Operation<duckdb::string_t,int>
          (TryCast *this,string_t input,int32_t *result,bool strict)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  char cVar12;
  long lVar13;
  byte bVar14;
  undefined4 uVar15;
  char *pcVar16;
  ulong uVar17;
  idx_t iVar18;
  bool bVar19;
  ExponentData exponent;
  byte local_88;
  IntegerDecimalCastData<int> local_78;
  int *local_58;
  undefined4 local_4c;
  ulong local_48;
  string_t input_local;
  
  local_58 = input.value._8_8_;
  input_local.value.pointer.ptr = input.value._0_8_;
  pcVar16 = input.value._0_8_;
  if ((uint)this < 0xd) {
    pcVar16 = input_local.value.pointer.prefix;
  }
  uVar5 = (ulong)this & 0xffffffff;
  uVar17 = 0;
  while( true ) {
    uVar8 = uVar5 - uVar17;
    local_88 = (byte)result;
    input_local.value._0_8_ = this;
    if (uVar8 == 0) break;
    bVar1 = pcVar16[uVar17];
    if ((4 < bVar1 - 9) && (bVar1 != 0x20)) {
      if (bVar1 == 0x2d) {
        uVar9 = uVar5 - uVar17;
        iVar3 = 0;
        uVar8 = 1;
        goto LAB_01263e05;
      }
      if ((uVar5 - 1 == uVar17) || (bVar1 != 0x30)) {
        if ((local_88 & bVar1 == 0x2b) == 0) {
          uVar9 = (ulong)(bVar1 == 0x2b);
LAB_01264000:
          iVar3 = 0;
          uVar11 = uVar9;
          goto LAB_0126400c;
        }
        break;
      }
      cVar12 = pcVar16[uVar17 + 1];
      if (cVar12 == 'B') {
LAB_012640eb:
        uVar8 = ~uVar17 + uVar5;
        uVar11 = 1;
        iVar3 = 0;
        goto LAB_012640fd;
      }
      if (cVar12 != 'x') {
        if (cVar12 == 'b') goto LAB_012640eb;
        if (cVar12 != 'X') {
          if ((local_88 & (byte)(cVar12 - 0x30U) < 10) == 0) {
            uVar9 = 0;
            goto LAB_01264000;
          }
          break;
        }
      }
      local_48 = ~uVar17 + uVar5;
      iVar3 = 0;
      uVar11 = 1;
      goto LAB_01263eff;
    }
    uVar17 = uVar17 + 1;
  }
LAB_012642b5:
  for (uVar17 = 0; uVar8 = uVar5 - uVar17, uVar8 != 0; uVar17 = uVar17 + 1) {
    bVar1 = pcVar16[uVar17];
    if ((0x20 < (ulong)bVar1) || ((0x100003e00U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
      local_78._16_8_ = 0;
      local_78.result = 0;
      local_78.decimal = 0;
      if (bVar1 == 0x2d) {
        local_78.result = 0;
        uVar9 = 1;
        goto LAB_01264309;
      }
      if ((uVar5 - 1 != uVar17) && (bVar1 == 0x30)) {
        cVar12 = pcVar16[uVar17 + 1];
        if (cVar12 == 'B') {
LAB_01264668:
          local_78.result = 0;
          uVar8 = 1;
          goto LAB_01264683;
        }
        if (cVar12 != 'x') {
          if (cVar12 == 'b') goto LAB_01264668;
          if (cVar12 != 'X') {
            if ((local_88 & (byte)(cVar12 - 0x30U) < 10) != 0) {
              return false;
            }
            uVar9 = 0;
            goto LAB_012644dc;
          }
        }
        lVar13 = 0;
        uVar8 = 1;
        goto LAB_012643f6;
      }
      if ((local_88 & bVar1 == 0x2b) == 0) {
        uVar9 = (ulong)(bVar1 == 0x2b);
LAB_012644dc:
        local_78.result = 0;
        uVar11 = uVar9;
        goto LAB_012644e7;
      }
      break;
    }
  }
  goto LAB_01264aa3;
LAB_01263e05:
  uVar11 = uVar8;
  if (uVar9 <= uVar11) goto joined_r0x0126429d;
  bVar1 = pcVar16[uVar17 + uVar11];
  bVar14 = bVar1 - 0x30;
  if (9 < bVar14) {
    if (bVar1 == 0x2e) {
      if (local_88 != 0) goto LAB_012642b5;
      if (uVar9 <= uVar11 + 1) goto joined_r0x0126429d;
      if ((uVar11 < 2) ||
         (bVar1 = pcVar16[uVar17 + 1 + uVar11], uVar11 = uVar11 + 1, (byte)(bVar1 - 0x30) < 10))
      goto LAB_012642b5;
    }
    if ((bVar1 < 0x21) && ((0x100003e00U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      uVar8 = uVar11 + 1;
      uVar11 = uVar8;
      if (uVar8 < uVar9) {
        uVar11 = uVar9;
      }
      goto LAB_012641b1;
    }
    goto LAB_012642b5;
  }
  uVar2 = (0x80000000 - bVar14) / 10;
  if ((SBORROW4(iVar3,-uVar2) != (int)(iVar3 + uVar2) < 0) ||
     (((iVar3 = iVar3 * 10 - (uint)bVar14, uVar8 = uVar9, ~uVar11 + uVar5 != uVar17 &&
       (uVar8 = uVar11 + 1, pcVar16[uVar17 + 1 + uVar11] == '_' && local_88 == 0)) &&
      (((uVar5 - uVar11) - 2 == uVar17 ||
       (uVar8 = uVar11 + 2, 9 < (byte)(pcVar16[uVar17 + 2 + uVar11] - 0x30U)))))))
  goto LAB_012642b5;
  goto LAB_01263e05;
LAB_012641b1:
  if (uVar9 <= uVar8) goto joined_r0x0126429d;
  if ((0x20 < (ulong)(byte)pcVar16[uVar17 + uVar8]) ||
     ((0x100003e00U >> ((ulong)(byte)pcVar16[uVar17 + uVar8] & 0x3f) & 1) == 0)) goto LAB_012642b5;
  uVar8 = uVar8 + 1;
  goto LAB_012641b1;
LAB_012640fd:
  if (uVar8 <= uVar11) goto joined_r0x0126429d;
  iVar10 = 0;
  if (pcVar16[uVar17 + 1 + uVar11] != '0') {
    if (pcVar16[uVar17 + 1 + uVar11] != '1') goto LAB_012642b5;
    iVar10 = 1;
  }
  uVar9 = uVar8;
  if ((uVar5 - uVar11) - 2 != uVar17) {
    if (pcVar16[uVar17 + 2 + uVar11] == '_') {
      if (((uVar5 - uVar11) - 3 == uVar17) || ((pcVar16[uVar17 + 3 + uVar11] & 0xfeU) != 0x30))
      goto LAB_012642b5;
      uVar9 = uVar11 + 2;
    }
    else {
      uVar9 = uVar11 + 1;
    }
  }
  uVar11 = uVar9;
  if (0x3fffffff < iVar3) goto LAB_012642b5;
  iVar3 = iVar10 + iVar3 * 2;
  goto LAB_012640fd;
LAB_0126400c:
  uVar4 = uVar11;
  if (uVar8 <= uVar4) goto LAB_012641ea;
  bVar1 = pcVar16[uVar17 + uVar4];
  bVar14 = bVar1 - 0x30;
  if (9 < bVar14) {
    if (bVar1 == 0x2e) {
      if (local_88 != 0) goto LAB_012642b5;
      uVar11 = uVar4 + 1;
      if (uVar8 <= uVar11) {
        bVar19 = uVar9 < uVar4;
        uVar4 = uVar11;
        if (bVar19) goto LAB_012641ea;
        goto LAB_012642b5;
      }
      if ((uVar4 <= uVar9) ||
         (bVar1 = pcVar16[uVar17 + 1 + uVar4], uVar4 = uVar11, (byte)(bVar1 - 0x30) < 10))
      goto LAB_012642b5;
    }
    if ((bVar1 < 0x21) && ((0x100003e00U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      uVar11 = uVar4 + 1;
      uVar4 = uVar11;
      if (uVar11 < uVar8) {
        uVar4 = uVar8;
      }
      goto LAB_01264276;
    }
    goto LAB_012642b5;
  }
  if (((int)((bVar14 ^ 0x7ffffffe) / 10) < iVar3) ||
     (((iVar3 = iVar3 * 10 + (uint)bVar14, uVar11 = uVar8, ~uVar4 + uVar5 != uVar17 &&
       (uVar11 = uVar4 + 1, pcVar16[uVar17 + 1 + uVar4] == '_' && local_88 == 0)) &&
      (((uVar5 - uVar4) - 2 == uVar17 ||
       (uVar11 = uVar4 + 2, 9 < (byte)(pcVar16[uVar17 + 2 + uVar4] - 0x30U))))))) goto LAB_012642b5;
  goto LAB_0126400c;
LAB_01264276:
  if (uVar8 <= uVar11) goto LAB_012641ea;
  if ((0x20 < (ulong)(byte)pcVar16[uVar17 + uVar11]) ||
     ((0x100003e00U >> ((ulong)(byte)pcVar16[uVar17 + uVar11] & 0x3f) & 1) == 0)) goto LAB_012642b5;
  uVar11 = uVar11 + 1;
  goto LAB_01264276;
LAB_012641ea:
  if (uVar9 < uVar4) goto LAB_0126429f;
  goto LAB_012642b5;
LAB_01263eff:
  if (local_48 <= uVar11) goto joined_r0x0126429d;
  bVar1 = pcVar16[uVar17 + 1 + uVar11];
  bVar14 = bVar1 | 0x20;
  if (0x19 < (byte)(bVar1 + 0xbf)) {
    bVar14 = bVar1;
  }
  bVar19 = StringUtil::CharacterIsHex(bVar14);
  if (!bVar19) goto LAB_012642b5;
  uVar15 = 0xd0;
  if ('`' < (char)bVar14) {
    uVar15 = 0xa9;
  }
  uVar8 = local_48;
  if ((uVar5 - uVar11) - 2 != uVar17) {
    if (pcVar16[uVar17 + 2 + uVar11] == '_') {
      local_4c = uVar15;
      if (((uVar5 - uVar11) - 3 == uVar17) ||
         (bVar19 = StringUtil::CharacterIsHex(pcVar16[uVar17 + 3 + uVar11]), !bVar19))
      goto LAB_012642b5;
      uVar8 = uVar11 + 2;
      uVar15 = local_4c;
    }
    else {
      uVar8 = uVar11 + 1;
    }
  }
  bVar14 = (char)uVar15 + bVar14;
  if ((int)(bVar14 >> 4 ^ 0x7ffffff) < iVar3) goto LAB_012642b5;
  iVar3 = iVar3 * 0x10 + (uint)bVar14;
  uVar11 = uVar8;
  goto LAB_01263eff;
joined_r0x0126429d:
  if (uVar11 < 2) goto LAB_012642b5;
LAB_0126429f:
  *local_58 = iVar3;
  goto LAB_012648af;
LAB_01264309:
  uVar11 = uVar9;
  if (uVar8 <= uVar11) goto LAB_01264585;
  bVar1 = pcVar16[uVar17 + uVar11];
  bVar14 = bVar1 - 0x30;
  if (9 < bVar14) {
    if (bVar1 != 0x2e) goto LAB_01264706;
    if (local_88 != 0) goto LAB_01264aa3;
    uVar9 = uVar11 + 1;
    local_78.decimal_digits = 0;
    uVar4 = uVar9;
    local_78.decimal = 0;
    goto LAB_012645cf;
  }
  uVar9 = (0x8000000000000000 - (ulong)bVar14) / 10;
  if (SBORROW8(local_78.result,-uVar9) != (long)(local_78.result + uVar9) < 0) {
    return false;
  }
  local_78.result = local_78.result * 10 - (ulong)bVar14;
  uVar9 = uVar8;
  if ((~uVar11 + uVar5 != uVar17) &&
     (uVar9 = uVar11 + 1, pcVar16[uVar17 + 1 + uVar11] == '_' && local_88 == 0)) {
    if ((uVar5 - uVar11) - 2 == uVar17) goto LAB_01264aa3;
    uVar9 = uVar11 + 2;
    if (9 < (byte)(pcVar16[uVar17 + 2 + uVar11] - 0x30U)) {
      return false;
    }
  }
  goto LAB_01264309;
LAB_012645cf:
  uVar7 = uVar4;
  if (uVar8 <= uVar7) {
    bVar19 = 1 < uVar11;
    local_78._18_6_ = 0;
    uVar11 = uVar7;
    if (uVar9 < uVar7 || bVar19) goto LAB_01264585;
    goto LAB_01264aa3;
  }
  bVar1 = pcVar16[uVar17 + uVar7];
  bVar14 = bVar1 - 0x30;
  if (9 < bVar14) {
    bVar19 = 1 < uVar11;
    local_78._18_6_ = 0;
    uVar11 = uVar7;
    if (uVar9 < uVar7 || bVar19) goto LAB_01264706;
    goto LAB_01264aa3;
  }
  uVar4 = ((ulong)bVar14 ^ 0x7ffffffffffffffe) / 10;
  lVar13 = local_78.decimal * 10 + (ulong)bVar14;
  if ((long)uVar4 < local_78.decimal) {
    lVar13 = local_78.decimal;
  }
  local_78.decimal_digits = local_78.decimal_digits + (local_78.decimal <= (long)uVar4);
  uVar4 = uVar8;
  local_78.decimal = lVar13;
  if ((~uVar7 + uVar5 != uVar17) && (uVar4 = uVar7 + 1, pcVar16[uVar17 + 1 + uVar7] == '_')) {
    if ((uVar5 - uVar7) - 2 == uVar17) goto LAB_01264aa3;
    uVar4 = uVar7 + 2;
    if (9 < (byte)(pcVar16[uVar17 + 2 + uVar7] - 0x30U)) {
      return false;
    }
  }
  goto LAB_012645cf;
LAB_01264706:
  uVar2 = (uint)bVar1;
  if (4 < uVar2 - 9) {
    if ((uVar2 == 0x65) || (uVar2 == 0x45)) {
      if ((uVar11 != 1 && local_88 == 0) && (uVar11 + 1 < uVar8)) {
        exponent.result = 0;
        pcVar16 = pcVar16 + uVar17 + uVar11 + 1;
        iVar18 = ~uVar17 + (uVar5 - uVar11);
        if (*pcVar16 == '-') {
          bVar19 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar16,iVar18,&exponent,false);
        }
        else {
          bVar19 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar16,iVar18,&exponent,false);
        }
        if (bVar19 != false) {
          bVar19 = IntegerDecimalCastOperation::
                   HandleExponent<duckdb::IntegerDecimalCastData<int>,true>
                             (&local_78,exponent.result);
          goto joined_r0x0126489e;
        }
      }
    }
    else if (uVar2 == 0x20) goto LAB_01264715;
    goto LAB_01264aa3;
  }
LAB_01264715:
  uVar5 = uVar11 + 1;
  uVar11 = uVar5;
  if (uVar5 < uVar8) {
    uVar11 = uVar8;
  }
  for (; uVar5 < uVar8; uVar5 = uVar5 + 1) {
    if ((0x20 < (ulong)(byte)pcVar16[uVar17 + uVar5]) ||
       ((0x100003e00U >> ((ulong)(byte)pcVar16[uVar17 + uVar5] & 0x3f) & 1) == 0))
    goto LAB_01264aa3;
  }
LAB_01264585:
  bVar19 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,true>
                     (&local_78);
  if (!bVar19) {
    return false;
  }
  if (uVar11 < 2) {
    return false;
  }
  goto LAB_012648a4;
LAB_01264683:
  if (~uVar17 + uVar5 <= uVar8) goto LAB_0126483b;
  uVar9 = 0;
  if ((pcVar16[uVar17 + 1 + uVar8] != '0') && (uVar9 = 1, pcVar16[uVar17 + 1 + uVar8] != '1')) {
    return false;
  }
  uVar11 = ~uVar17 + uVar5;
  if ((uVar5 - uVar8) - 2 != uVar17) {
    if (pcVar16[uVar17 + 2 + uVar8] == '_') {
      if (((uVar5 - uVar8) - 3 == uVar17) || ((pcVar16[uVar17 + 3 + uVar8] & 0xfeU) != 0x30))
      goto LAB_01264aa3;
      uVar11 = uVar8 + 2;
    }
    else {
      uVar11 = uVar8 + 1;
    }
  }
  uVar8 = uVar11;
  if (0x3fffffffffffffff < local_78.result) goto LAB_01264aa3;
  local_78.result = uVar9 + local_78.result * 2;
  goto LAB_01264683;
LAB_0126483b:
  bVar19 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,false>
                     (&local_78);
  goto LAB_01264899;
LAB_012643f6:
  if (~uVar17 + uVar5 <= uVar8) goto LAB_01264888;
  bVar1 = pcVar16[uVar17 + 1 + uVar8];
  bVar14 = bVar1 | 0x20;
  if (0x19 < (byte)(bVar1 + 0xbf)) {
    bVar14 = bVar1;
  }
  bVar19 = StringUtil::CharacterIsHex(bVar14);
  if (!bVar19) goto LAB_01264aa3;
  cVar12 = -0x30;
  if ('`' < (char)bVar14) {
    cVar12 = -0x57;
  }
  uVar9 = ~uVar17 + uVar5;
  if ((uVar5 - uVar8) - 2 != uVar17) {
    if (pcVar16[uVar17 + 2 + uVar8] == '_') {
      if (((uVar5 - uVar8) - 3 == uVar17) ||
         (bVar19 = StringUtil::CharacterIsHex(pcVar16[uVar17 + 3 + uVar8]), !bVar19))
      goto LAB_01264aa3;
      uVar9 = uVar8 + 2;
    }
    else {
      uVar9 = uVar8 + 1;
    }
  }
  if ((long)((ulong)((byte)(cVar12 + bVar14) >> 4) ^ 0x7ffffffffffffff) < lVar13) goto LAB_01264aa3;
  lVar13 = lVar13 * 0x10 + (ulong)(byte)(cVar12 + bVar14);
  uVar8 = uVar9;
  goto LAB_012643f6;
LAB_012644e7:
  uVar4 = uVar11;
  if (uVar8 <= uVar4) goto LAB_01264758;
  bVar1 = pcVar16[uVar17 + uVar4];
  bVar14 = bVar1 - 0x30;
  if (9 < bVar14) {
    if (bVar1 != 0x2e) goto LAB_012648b9;
    if (local_88 != 0) goto LAB_01264aa3;
    uVar11 = uVar4 + 1;
    local_78.decimal_digits = 0;
    uVar7 = uVar11;
    local_78.decimal = 0;
    goto LAB_012647a2;
  }
  if ((long)(((ulong)bVar14 ^ 0x7ffffffffffffffe) / 10) < local_78.result) {
    return false;
  }
  local_78.result = local_78.result * 10 + (ulong)bVar14;
  uVar11 = uVar8;
  if ((~uVar4 + uVar5 != uVar17) &&
     (uVar11 = uVar4 + 1, pcVar16[uVar17 + 1 + uVar4] == '_' && local_88 == 0)) {
    if ((uVar5 - uVar4) - 2 == uVar17) goto LAB_01264aa3;
    uVar11 = uVar4 + 2;
    if (9 < (byte)(pcVar16[uVar17 + 2 + uVar4] - 0x30U)) {
      return false;
    }
  }
  goto LAB_012644e7;
LAB_012647a2:
  uVar6 = uVar7;
  if (uVar8 <= uVar6) {
    bVar19 = uVar9 < uVar4;
    local_78._18_6_ = 0;
    uVar4 = uVar6;
    if (uVar11 < uVar6 || bVar19) goto LAB_01264758;
    goto LAB_01264aa3;
  }
  bVar1 = pcVar16[uVar17 + uVar6];
  bVar14 = bVar1 - 0x30;
  if (9 < bVar14) {
    bVar19 = uVar9 < uVar4;
    local_78._18_6_ = 0;
    uVar4 = uVar6;
    if (uVar11 < uVar6 || bVar19) goto LAB_012648b9;
    goto LAB_01264aa3;
  }
  uVar7 = ((ulong)bVar14 ^ 0x7ffffffffffffffe) / 10;
  lVar13 = local_78.decimal * 10 + (ulong)bVar14;
  if ((long)uVar7 < local_78.decimal) {
    lVar13 = local_78.decimal;
  }
  local_78.decimal_digits = local_78.decimal_digits + (local_78.decimal <= (long)uVar7);
  uVar7 = uVar8;
  local_78.decimal = lVar13;
  if ((~uVar6 + uVar5 != uVar17) && (uVar7 = uVar6 + 1, pcVar16[uVar17 + 1 + uVar6] == '_')) {
    if ((uVar5 - uVar6) - 2 == uVar17) goto LAB_01264aa3;
    uVar7 = uVar6 + 2;
    if (9 < (byte)(pcVar16[uVar17 + 2 + uVar6] - 0x30U)) {
      return false;
    }
  }
  goto LAB_012647a2;
LAB_012648b9:
  uVar2 = (uint)bVar1;
  if (uVar2 - 9 < 5) {
LAB_012648c8:
    uVar5 = uVar4 + 1;
    uVar4 = uVar5;
    if (uVar5 < uVar8) {
      uVar4 = uVar8;
    }
    for (; uVar5 < uVar8; uVar5 = uVar5 + 1) {
      if ((0x20 < (ulong)(byte)pcVar16[uVar17 + uVar5]) ||
         ((0x100003e00U >> ((ulong)(byte)pcVar16[uVar17 + uVar5] & 0x3f) & 1) == 0))
      goto LAB_01264aa3;
    }
LAB_01264758:
    bVar19 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,false>
                       (&local_78);
    if (!bVar19) {
      return false;
    }
    if (uVar4 <= uVar9) {
      return false;
    }
    goto LAB_012648a4;
  }
  if ((uVar2 == 0x65) || (uVar2 == 0x45)) {
    if ((uVar4 == uVar9 || local_88 != 0) || (uVar8 <= uVar4 + 1)) goto LAB_01264aa3;
    exponent.result = 0;
    pcVar16 = pcVar16 + uVar17 + uVar4 + 1;
    iVar18 = ~uVar17 + (uVar5 - uVar4);
    if (*pcVar16 == '-') {
      bVar19 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                         (pcVar16,iVar18,&exponent,false);
    }
    else {
      bVar19 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                         (pcVar16,iVar18,&exponent,false);
    }
    if (bVar19 == false) goto LAB_01264aa3;
    bVar19 = IntegerDecimalCastOperation::HandleExponent<duckdb::IntegerDecimalCastData<int>,false>
                       (&local_78,exponent.result);
    goto joined_r0x0126489e;
  }
  if (uVar2 == 0x20) goto LAB_012648c8;
  goto LAB_01264aa3;
LAB_01264888:
  local_78.result = lVar13;
  bVar19 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,false>
                     (&local_78);
LAB_01264899:
  bVar19 = (bool)(1 < uVar8 & bVar19);
joined_r0x0126489e:
  if (bVar19 == false) {
LAB_01264aa3:
    bVar19 = false;
  }
  else {
LAB_012648a4:
    *local_58 = (int)local_78.result;
LAB_012648af:
    bVar19 = true;
  }
  return bVar19;
}

Assistant:

bool TryCast::Operation(string_t input, int32_t &result, bool strict) {
	return TrySimpleIntegerCast<int32_t>(input.GetData(), input.GetSize(), result, strict);
}